

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O3

QPlainTextEdit * __thiscall QPlainTextEdit::cursorForPosition(QPlainTextEdit *this,QPoint *pos)

{
  long lVar1;
  QPoint this_00;
  QPlainTextEditControl *pos_00;
  LayoutDirection LVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = pos[1];
  pos_00 = *(QPlainTextEditControl **)((long)this_00 + 800);
  LVar2 = QWidget::layoutDirection(*(QWidget **)((long)this_00 + 8));
  if (LVar2 == RightToLeft) {
    QAbstractSlider::maximum(&(*(QScrollBar **)((long)this_00 + 0x288))->super_QAbstractSlider);
    QAbstractSlider::value(&(*(QScrollBar **)((long)this_00 + 0x288))->super_QAbstractSlider);
  }
  else {
    QAbstractSlider::value(&(*(QScrollBar **)((long)this_00 + 0x288))->super_QAbstractSlider);
  }
  QPlainTextEditPrivate::verticalOffset
            ((QPlainTextEditPrivate *)this_00,
             (*(QPlainTextEditControl **)((long)this_00 + 800))->topBlock,
             *(int *)((long)this_00 + 0x344));
  QWidgetTextControl::cursorForPosition((QWidgetTextControl *)this,(QPointF *)pos_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QTextCursor QPlainTextEdit::cursorForPosition(const QPoint &pos) const
{
    Q_D(const QPlainTextEdit);
    return d->control->cursorForPosition(d->mapToContents(pos));
}